

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_VelFromAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  DAngle speed_00;
  bool bVar1;
  bool local_53;
  TAngle<double> local_50;
  TAngle<double> local_48;
  DAngle angle;
  double speed;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1de0,
                  "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1de0,
                  "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_53 = true;
  if (this != (AActor *)0x0) {
    local_53 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_53 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1de0,
                  "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam == 1) {
    AActor::VelFromAngle(this);
  }
  else {
    if (numparam < 2) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1de7,
                    "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[1].field_0.field_3.Type != '\x01') {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1de7,
                    "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    angle.Degrees = *(double *)&param[1].field_0;
    if (numparam == 2) {
      AActor::VelFromAngle(this,angle.Degrees);
    }
    else {
      if (numparam < 3) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1dee,
                      "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (param[2].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1dee,
                      "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      TAngle<double>::TAngle(&local_48,param[2].field_0.f);
      speed_00.Degrees = angle.Degrees;
      TAngle<double>::TAngle(&local_50,&local_48);
      AActor::VelFromAngle(this,speed_00.Degrees,&local_50);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, VelFromAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (numparam == 1)
	{
		self->VelFromAngle();
	}
	else
	{
		PARAM_FLOAT(speed);
		if (numparam == 2)
		{
			self->VelFromAngle(speed);
		}
		else
		{
			PARAM_ANGLE(angle);
			self->VelFromAngle(speed, angle);
		}
	}
	return 0;
}